

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

string * bin_str_to_hex(string *__return_storage_ptr__,string *str)

{
  uint *puVar1;
  size_type sVar2;
  long lVar3;
  string *psVar4;
  size_type sVar5;
  ostringstream ret;
  undefined1 auStack_1b8 [8];
  string *local_1b0;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      lVar3 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar3 + 1] == '\0') {
        std::ios::widen((char)auStack_1b8 + (char)lVar3 + '\x10');
        acStack_c8[lVar3 + 1] = '\x01';
      }
      acStack_c8[lVar3] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  psVar4 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string bin_str_to_hex(const std::string &str) {
    std::ostringstream ret;

    for (uint8_t i : str) {
        uint32_t c = static_cast<uint32_t>(i);
        ret << std::hex << std::setfill('0') << std::setw(2) << std::uppercase
            << c;
    }
    return ret.str();
}